

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * rawMonthName(QCalendarLocale *localeData,char16_t *monthsData,int month,FormatType type)

{
  long lVar1;
  undefined4 in_ECX;
  QCalendarLocale *in_RSI;
  QString *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  DataRange range;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = in_R8D;
  if (in_R8D == 0) {
    QCalendarLocale::longMonth(in_RSI);
  }
  else if (in_R8D == 1) {
    QCalendarLocale::shortMonth(in_RSI);
  }
  else {
    if (in_R8D != 2) {
      QString::QString((QString *)0x4d20c5);
      goto LAB_004d20e5;
    }
    QCalendarLocale::narrowMonth(in_RSI);
  }
  QLocaleData::DataRange::getListEntry
            ((DataRange *)CONCAT44(in_ECX,iVar2),
             (char16_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0),(qsizetype)in_RDI);
LAB_004d20e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString rawMonthName(const QCalendarLocale &localeData,
                            const char16_t *monthsData, int month,
                            QLocale::FormatType type)
{
    QLocaleData::DataRange range;
    switch (type) {
    case QLocale::LongFormat:
        range = localeData.longMonth();
        break;
    case QLocale::ShortFormat:
        range = localeData.shortMonth();
        break;
    case QLocale::NarrowFormat:
        range = localeData.narrowMonth();
        break;
    default:
        return QString();
    }
    return range.getListEntry(monthsData, month - 1);
}